

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

bool __thiscall glslang::TQualifier::isPipeInput(TQualifier *this)

{
  uint uVar1;
  TQualifier *this_local;
  
  uVar1 = *(uint *)&this->field_0x8 & 0x7f;
  if (((uVar1 == 3) || (uVar1 - 0x14 < 2)) || (uVar1 - 0x19 < 3)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool isPipeInput() const
    {
        switch (storage) {
        case EvqVaryingIn:
        case EvqFragCoord:
        case EvqPointCoord:
        case EvqFace:
        case EvqVertexId:
        case EvqInstanceId:
            return true;
        default:
            return false;
        }
    }